

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

int fsnav_time_epochs_compare(fsnav_time_epoch *date1,fsnav_time_epoch *date2)

{
  double dVar1;
  int local_3c;
  double dx;
  int ix;
  double time_precision;
  fsnav_time_epoch *date2_local;
  fsnav_time_epoch *date1_local;
  
  if (date1->Y == date2->Y) {
    if (date1->M == date2->M) {
      if (date1->D == date2->D) {
        if (date1->h == date2->h) {
          if (date1->m == date2->m) {
            dVar1 = date1->s - date2->s;
            if (dVar1 <= 3.0517578125e-05) {
              local_3c = 0;
              if (dVar1 < -3.0517578125e-05) {
                local_3c = -1;
              }
            }
            else {
              local_3c = 1;
            }
            date1_local._4_4_ = local_3c;
          }
          else {
            date1_local._4_4_ = -1;
            if (0 < date1->m - date2->m) {
              date1_local._4_4_ = 1;
            }
          }
        }
        else {
          date1_local._4_4_ = -1;
          if (0 < date1->h - date2->h) {
            date1_local._4_4_ = 1;
          }
        }
      }
      else {
        date1_local._4_4_ = -1;
        if (0 < date1->D - date2->D) {
          date1_local._4_4_ = 1;
        }
      }
    }
    else {
      date1_local._4_4_ = -1;
      if (0 < date1->M - date2->M) {
        date1_local._4_4_ = 1;
      }
    }
  }
  else {
    date1_local._4_4_ = -1;
    if (0 < date1->Y - date2->Y) {
      date1_local._4_4_ = 1;
    }
  }
  return date1_local._4_4_;
}

Assistant:

int fsnav_time_epochs_compare(fsnav_time_epoch* date1, fsnav_time_epoch* date2)
{
	const double time_precision = 1./(0x01<<15); // 1/32768, guaranteed non-zero in half precision

	int ix;
	double dx;

	ix = date1->Y - date2->Y; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->M - date2->M; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->D - date2->D; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->h - date2->h; if (ix) return (ix > 0) ? 1 : -1;
	ix = date1->m - date2->m; if (ix) return (ix > 0) ? 1 : -1;

	dx = date1->s - date2->s; return (dx > time_precision) ? 1 : ((dx < -time_precision) ? -1 : 0);
}